

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_flm.cpp
# Opt level: O2

void __thiscall phoenix_flm_t::flm_entry_t::~flm_entry_t(flm_entry_t *this)

{
  ~flm_entry_t(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

phoenix_flm_t::flm_entry_t::~flm_entry_t() {
    _clean_up();
}